

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::pack::Atlas::Atlas(Atlas *this)

{
  Atlas *this_local;
  
  Array<xatlas::internal::pack::AtlasImage_*>::Array(&this->m_atlasImages,0);
  Array<float>::Array(&this->m_utilization,0);
  Array<xatlas::internal::BitImage_*>::Array(&this->m_bitImages,0);
  Array<xatlas::internal::pack::Chart_*>::Array(&this->m_charts,0);
  RadixSort::RadixSort(&this->m_radix);
  this->m_width = 0;
  this->m_height = 0;
  this->m_texelsPerUnit = 0.0;
  KISSRng::KISSRng(&this->m_rand);
  return;
}

Assistant:

~Atlas()
	{
		for (uint32_t i = 0; i < m_atlasImages.size(); i++) {
			m_atlasImages[i]->~AtlasImage();
			XA_FREE(m_atlasImages[i]);
		}
		for (uint32_t i = 0; i < m_bitImages.size(); i++) {
			m_bitImages[i]->~BitImage();
			XA_FREE(m_bitImages[i]);
		}
		for (uint32_t i = 0; i < m_charts.size(); i++) {
			m_charts[i]->~Chart();
			XA_FREE(m_charts[i]);
		}
	}